

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_message.c
# Opt level: O0

MQTT_MESSAGE * create_msg_object(uint16_t packetId,QOS_VALUE qosValue)

{
  MQTT_MESSAGE *__s;
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  MQTT_MESSAGE *result;
  QOS_VALUE qosValue_local;
  uint16_t packetId_local;
  
  __s = (MQTT_MESSAGE *)malloc(0x40);
  if (__s == (MQTT_MESSAGE *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_message.c"
                ,"create_msg_object",0x29,1,"Failure unable to allocate MQTT Message.");
    }
  }
  else {
    memset(__s,0,0x40);
    __s->packetId = packetId;
    __s->isDuplicateMsg = false;
    __s->isMessageRetained = false;
    __s->qosInfo = qosValue;
  }
  return __s;
}

Assistant:

static MQTT_MESSAGE* create_msg_object(uint16_t packetId, QOS_VALUE qosValue)
{
    MQTT_MESSAGE* result;
    result = (MQTT_MESSAGE*)malloc(sizeof(MQTT_MESSAGE));
    if (result != NULL)
    {
        memset(result, 0, sizeof(MQTT_MESSAGE));
        result->packetId = packetId;
        result->isDuplicateMsg = false;
        result->isMessageRetained = false;
        result->qosInfo = qosValue;
    }
    else
    {
        LogError("Failure unable to allocate MQTT Message.");
    }
    return result;
}